

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vbyte.hpp
# Opt level: O0

uint64_t poplar::vbyte::size(uint64_t val)

{
  uint64_t n;
  uint64_t val_local;
  
  n = 1;
  for (val_local = val; 0x7f < val_local; val_local = val_local >> 7) {
    n = n + 1;
  }
  return n;
}

Assistant:

inline uint64_t size(uint64_t val) {
    uint64_t n = 1;
    while (127ULL < val) {
        ++n;
        val >>= 7;
    }
    return n;
}